

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obu.c
# Opt level: O0

uint32_t read_sequence_header_obu(AV1Decoder *pbi,aom_read_bit_buffer *rb)

{
  int iVar1;
  BITSTREAM_PROFILE BVar2;
  int iVar3;
  int16_t aiVar4 [2];
  aom_codec_err_t aVar5;
  int iVar6;
  qm_val_t *pqVar7;
  long in_RSI;
  long in_RDI;
  int operating_point;
  int i;
  SequenceHeader *seq_params;
  SequenceHeader sh;
  uint32_t saved_bit_offset;
  AV1_COMMON *cm;
  undefined4 in_stack_fffffffffffff828;
  int in_stack_fffffffffffff82c;
  undefined4 in_stack_fffffffffffff830;
  int in_stack_fffffffffffff834;
  AV1Decoder *pbi_00;
  SequenceHeader *in_stack_fffffffffffff840;
  int in_stack_fffffffffffff848;
  int in_stack_fffffffffffff84c;
  AV1_COMMON *in_stack_fffffffffffff850;
  uint local_4;
  
  iVar1 = *(int *)(in_RSI + 0x10);
  memcpy(&stack0xfffffffffffff840,*(void **)(in_RDI + 0x9be8),0x798);
  pbi_00 = (AV1Decoder *)&stack0xfffffffffffff840;
  BVar2 = av1_read_profile((aom_read_bit_buffer *)
                           CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830));
  *(BITSTREAM_PROFILE *)((long)&(pbi_00->dcb).xd.plane[0].pre[0].buf + 5) = BVar2;
  if (*(char *)((long)&(pbi_00->dcb).xd.plane[0].pre[0].buf + 5) < '\x03') {
    iVar3 = aom_rb_read_bit((aom_read_bit_buffer *)pbi_00);
    *(char *)((long)&(pbi_00->dcb).xd.plane[0].dst.stride + 1) = (char)iVar3;
    iVar3 = aom_rb_read_bit((aom_read_bit_buffer *)pbi_00);
    *(char *)((long)&(pbi_00->dcb).xd.plane[0].dst.stride + 2) = (char)iVar3;
    if ((*(char *)((long)&(pbi_00->dcb).xd.plane[0].dst.stride + 1) == '\0') &&
       (*(char *)((long)&(pbi_00->dcb).xd.plane[0].dst.stride + 2) != '\0')) {
      *(undefined4 *)(in_RDI + 0x5ff08) = 5;
      local_4 = 0;
    }
    else {
      if (*(char *)((long)&(pbi_00->dcb).xd.plane[0].dst.stride + 2) == '\0') {
        iVar3 = aom_rb_read_bit((aom_read_bit_buffer *)pbi_00);
        *(int *)((pbi_00->dcb).xd.plane[0].seg_iqmatrix[0] + 7) = iVar3;
        if (*(int *)((pbi_00->dcb).xd.plane[0].seg_iqmatrix[0] + 7) == 0) {
          *(undefined1 *)((long)(pbi_00->dcb).xd.plane[0].seg_iqmatrix[0] + 0x4c) = 0;
        }
        else {
          av1_read_timing_info_header
                    ((aom_timing_info_t *)in_stack_fffffffffffff840,
                     (aom_internal_error_info *)pbi_00,
                     (aom_read_bit_buffer *)
                     CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830));
          iVar3 = aom_rb_read_bit((aom_read_bit_buffer *)pbi_00);
          *(char *)((long)(pbi_00->dcb).xd.plane[0].seg_iqmatrix[0] + 0x4c) = (char)iVar3;
          if (*(char *)((long)(pbi_00->dcb).xd.plane[0].seg_iqmatrix[0] + 0x4c) != '\0') {
            av1_read_decoder_model_info
                      ((aom_dec_model_info_t *)
                       CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                       (aom_read_bit_buffer *)
                       CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828));
          }
        }
        iVar3 = aom_rb_read_bit((aom_read_bit_buffer *)pbi_00);
        *(char *)((pbi_00->dcb).xd.plane[0].seg_iqmatrix[0] + 0xc) = (char)iVar3;
        iVar3 = aom_rb_read_literal((aom_read_bit_buffer *)
                                    CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                                    in_stack_fffffffffffff82c);
        (pbi_00->dcb).xd.plane[0].pre[1].width = iVar3;
        *(undefined1 *)((long)(pbi_00->dcb).xd.plane[0].seg_iqmatrix[0] + 0x34) = 0;
        for (in_stack_fffffffffffff834 = 0;
            in_stack_fffffffffffff834 < (pbi_00->dcb).xd.plane[0].pre[1].width + 1;
            in_stack_fffffffffffff834 = in_stack_fffffffffffff834 + 1) {
          aiVar4 = (int16_t  [2])
                   aom_rb_read_literal((aom_read_bit_buffer *)
                                       CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830)
                                       ,in_stack_fffffffffffff82c);
          (pbi_00->dcb).xd.plane[0].seg_dequant_QTX[(long)in_stack_fffffffffffff834 + -7] = aiVar4;
          if ((pbi_00->dcb).xd.plane[0].seg_dequant_QTX[(long)in_stack_fffffffffffff834 + -7] !=
              (int16_t  [2])0x0) {
            *(undefined1 *)((long)(pbi_00->dcb).xd.plane[0].seg_iqmatrix[0] + 0x34) = 1;
          }
          iVar3 = read_bitstream_level
                            ((AV1_LEVEL *)
                             CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828),
                             (aom_read_bit_buffer *)0x1d3bf0);
          if (iVar3 == 0) {
            *(undefined4 *)(in_RDI + 0x5ff08) = 5;
            return 0;
          }
          if (*(byte *)((long)(pbi_00->dcb).xd.plane[0].seg_iqmatrix[0] +
                       (long)in_stack_fffffffffffff834 + 0x61) < 8) {
            *(undefined1 *)
             ((long)(pbi_00->dcb).xd.plane[0].seg_iqmatrix[0] +
             (long)in_stack_fffffffffffff834 + 0x81) = 0;
          }
          else {
            iVar3 = aom_rb_read_bit((aom_read_bit_buffer *)pbi_00);
            *(char *)((long)(pbi_00->dcb).xd.plane[0].seg_iqmatrix[0] +
                     (long)in_stack_fffffffffffff834 + 0x81) = (char)iVar3;
          }
          if (*(char *)((long)(pbi_00->dcb).xd.plane[0].seg_iqmatrix[0] + 0x4c) == '\0') {
            *(undefined4 *)
             ((pbi_00->dcb).xd.plane[0].seg_iqmatrix[1] + (long)in_stack_fffffffffffff834 * 6 + 2) =
                 0;
          }
          else {
            iVar3 = aom_rb_read_bit((aom_read_bit_buffer *)pbi_00);
            *(int *)((pbi_00->dcb).xd.plane[0].seg_iqmatrix[1] +
                    (long)in_stack_fffffffffffff834 * 6 + 2) = iVar3;
            if (*(int *)((pbi_00->dcb).xd.plane[0].seg_iqmatrix[1] +
                        (long)in_stack_fffffffffffff834 * 6 + 2) != 0) {
              av1_read_op_parameters_info
                        ((aom_dec_model_op_parameters_t *)
                         CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                         in_stack_fffffffffffff82c,(aom_read_bit_buffer *)0x1d3ce4);
            }
          }
          if ((*(int *)((pbi_00->dcb).xd.plane[0].seg_iqmatrix[0] + 7) != 0) &&
             ((*(int *)((long)(pbi_00->dcb).xd.plane[0].seg_iqmatrix[0] + 0x44) != 0 ||
              (*(int *)((pbi_00->dcb).xd.plane[0].seg_iqmatrix[1] +
                       (long)in_stack_fffffffffffff834 * 6 + 2) != 0)))) {
            pqVar7 = (qm_val_t *)
                     av1_max_level_bitrate
                               (*(char *)((long)&(pbi_00->dcb).xd.plane[0].pre[0].buf + 5),
                                (uint)*(byte *)((long)(pbi_00->dcb).xd.plane[0].seg_iqmatrix[0] +
                                               (long)in_stack_fffffffffffff834 + 0x61),
                                (uint)*(byte *)((long)(pbi_00->dcb).xd.plane[0].seg_iqmatrix[0] +
                                               (long)in_stack_fffffffffffff834 + 0x81));
            (pbi_00->dcb).xd.plane[0].seg_iqmatrix[1][(long)in_stack_fffffffffffff834 * 6 + 3] =
                 pqVar7;
            if ((pbi_00->dcb).xd.plane[0].seg_iqmatrix[1][(long)in_stack_fffffffffffff834 * 6 + 3]
                == (qm_val_t *)0x0) {
              aom_internal_error((aom_internal_error_info *)(in_RDI + 0x5ff08),
                                 AOM_CODEC_UNSUP_BITSTREAM,
                                 "AV1 does not support this combination of profile, level, and tier."
                                );
            }
            (pbi_00->dcb).xd.plane[0].seg_iqmatrix[1][(long)in_stack_fffffffffffff834 * 6 + 4] =
                 (pbi_00->dcb).xd.plane[0].seg_iqmatrix[1][(long)in_stack_fffffffffffff834 * 6 + 3];
          }
          if (((*(int *)((pbi_00->dcb).xd.plane[0].seg_iqmatrix[0] + 7) != 0) &&
              (*(int *)((long)(pbi_00->dcb).xd.plane[0].seg_iqmatrix[0] + 0x44) != 0)) &&
             (*(int *)((pbi_00->dcb).xd.plane[0].seg_iqmatrix[1] +
                      (long)in_stack_fffffffffffff834 * 6 + 2) == 0)) {
            *(undefined4 *)
             ((pbi_00->dcb).xd.plane[0].seg_iqmatrix[1] + (long)in_stack_fffffffffffff834 * 6 + 5) =
                 70000;
            *(undefined4 *)
             ((long)(pbi_00->dcb).xd.plane[0].seg_iqmatrix[1] +
             (long)in_stack_fffffffffffff834 * 0x30 + 0x2c) = 20000;
            *(undefined4 *)
             ((pbi_00->dcb).xd.plane[0].seg_iqmatrix[1] + (long)in_stack_fffffffffffff834 * 6 + 6) =
                 0;
          }
          if ((char)((__sigset_t *)((pbi_00->dcb).xd.plane[0].seg_iqmatrix[0] + 0xc))->__val[0] ==
              '\0') {
            *(undefined4 *)
             ((long)(pbi_00->dcb).xd.plane[0].seg_iqmatrix[1] +
             (long)in_stack_fffffffffffff834 * 0x30 + 0x34) = 0;
            *(undefined4 *)
             ((pbi_00->dcb).xd.plane[0].seg_iqmatrix[1] + (long)in_stack_fffffffffffff834 * 6 + 7) =
                 10;
          }
          else {
            iVar3 = aom_rb_read_bit((aom_read_bit_buffer *)pbi_00);
            *(int *)((long)(pbi_00->dcb).xd.plane[0].seg_iqmatrix[1] +
                    (long)in_stack_fffffffffffff834 * 0x30 + 0x34) = iVar3;
            if (*(int *)((long)(pbi_00->dcb).xd.plane[0].seg_iqmatrix[1] +
                        (long)in_stack_fffffffffffff834 * 0x30 + 0x34) == 0) {
              *(undefined4 *)
               ((pbi_00->dcb).xd.plane[0].seg_iqmatrix[1] + (long)in_stack_fffffffffffff834 * 6 + 7)
                   = 10;
            }
            else {
              iVar3 = aom_rb_read_literal((aom_read_bit_buffer *)
                                          CONCAT44(in_stack_fffffffffffff834,
                                                   in_stack_fffffffffffff830),
                                          in_stack_fffffffffffff82c);
              *(int *)((pbi_00->dcb).xd.plane[0].seg_iqmatrix[1] +
                      (long)in_stack_fffffffffffff834 * 6 + 7) = iVar3 + 1;
              if (10 < *(int *)((pbi_00->dcb).xd.plane[0].seg_iqmatrix[1] +
                               (long)in_stack_fffffffffffff834 * 6 + 7)) {
                aom_internal_error((aom_internal_error_info *)(in_RDI + 0x5ff08),
                                   AOM_CODEC_UNSUP_BITSTREAM,
                                   "AV1 does not support more than 10 decoded frames delay");
              }
            }
          }
        }
      }
      else {
        *(undefined4 *)((pbi_00->dcb).xd.plane[0].seg_iqmatrix[0] + 7) = 0;
        *(undefined1 *)((long)(pbi_00->dcb).xd.plane[0].seg_iqmatrix[0] + 0x4c) = 0;
        *(undefined1 *)((pbi_00->dcb).xd.plane[0].seg_iqmatrix[0] + 0xc) = 0;
        (pbi_00->dcb).xd.plane[0].pre[1].width = 0;
        (pbi_00->dcb).xd.plane[0].pre[1].height = 0;
        *(undefined1 *)((long)(pbi_00->dcb).xd.plane[0].seg_iqmatrix[0] + 0x34) = 0;
        iVar3 = read_bitstream_level
                          ((AV1_LEVEL *)
                           CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828),
                           (aom_read_bit_buffer *)0x1d3a3a);
        if (iVar3 == 0) {
          *(undefined4 *)(in_RDI + 0x5ff08) = 5;
          return 0;
        }
        *(undefined1 *)((long)(pbi_00->dcb).xd.plane[0].seg_iqmatrix[0] + 0x81) = 0;
        *(undefined4 *)((pbi_00->dcb).xd.plane[0].seg_iqmatrix[1] + 2) = 0;
        *(undefined4 *)((long)(pbi_00->dcb).xd.plane[0].seg_iqmatrix[1] + 0x34) = 0;
      }
      iVar3 = *(int *)(in_RDI + 0x58db0);
      if ((iVar3 < 0) || ((pbi_00->dcb).xd.plane[0].pre[1].width < iVar3)) {
        iVar3 = 0;
      }
      *(int16_t (*) [2])(in_RDI + 0x58db4) =
           (pbi_00->dcb).xd.plane[0].seg_dequant_QTX[(long)iVar3 + -7];
      aVar5 = aom_get_num_layers_from_operating_point_idc
                        (*(int *)(in_RDI + 0x58db4),(uint *)(in_RDI + 0x600ac),
                         (uint *)(in_RDI + 0x600a8));
      if (aVar5 == AOM_CODEC_OK) {
        av1_read_sequence_header
                  (in_stack_fffffffffffff850,
                   (aom_read_bit_buffer *)
                   CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                   in_stack_fffffffffffff840);
        av1_read_color_config
                  ((aom_read_bit_buffer *)in_stack_fffffffffffff850,in_stack_fffffffffffff84c,
                   in_stack_fffffffffffff840,(aom_internal_error_info *)pbi_00);
        if ((((*(int *)&(pbi_00->dcb).xd.plane[0].pre[1].buf != 0) ||
             (*(int *)((long)&(pbi_00->dcb).xd.plane[0].pre[1].buf + 4) != 0)) &&
            ((*(int *)&(pbi_00->dcb).xd.plane[0].pre[1].buf != 1 ||
             (*(int *)((long)&(pbi_00->dcb).xd.plane[0].pre[1].buf + 4) != 1)))) &&
           ((*(int *)&(pbi_00->dcb).xd.plane[0].pre[1].buf != 1 ||
            (*(int *)((long)&(pbi_00->dcb).xd.plane[0].pre[1].buf + 4) != 0)))) {
          aom_internal_error((aom_internal_error_info *)(in_RDI + 0x5ff08),AOM_CODEC_UNSUP_BITSTREAM
                             ,
                             "Only 4:4:4, 4:2:2 and 4:2:0 are currently supported, %d %d subsampling is not supported.\n"
                             ,(ulong)*(uint *)&(pbi_00->dcb).xd.plane[0].pre[1].buf,
                             (ulong)*(uint *)((long)&(pbi_00->dcb).xd.plane[0].pre[1].buf + 4));
        }
        iVar6 = aom_rb_read_bit((aom_read_bit_buffer *)pbi_00);
        *(char *)((long)&(pbi_00->dcb).xd.plane[0].pre[1].buf0 + 5) = (char)iVar6;
        iVar6 = av1_check_trailing_bits
                          (pbi_00,(aom_read_bit_buffer *)CONCAT44(in_stack_fffffffffffff834,iVar3));
        if (iVar6 == 0) {
          if ((*(int *)(in_RDI + 0x58da8) != 0) &&
             (iVar3 = are_seq_headers_consistent
                                ((SequenceHeader *)CONCAT44(in_stack_fffffffffffff834,iVar3),
                                 (SequenceHeader *)
                                 CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828)),
             iVar3 == 0)) {
            *(undefined4 *)(in_RDI + 0x58dac) = 1;
          }
          memcpy(*(void **)(in_RDI + 0x9be8),pbi_00,0x798);
          *(undefined4 *)(in_RDI + 0x58da8) = 1;
          local_4 = (*(int *)(in_RSI + 0x10) - iVar1) + 7U >> 3;
        }
        else {
          local_4 = 0;
        }
      }
      else {
        *(undefined4 *)(in_RDI + 0x5ff08) = 1;
        local_4 = 0;
      }
    }
  }
  else {
    *(undefined4 *)(in_RDI + 0x5ff08) = 5;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static uint32_t read_sequence_header_obu(AV1Decoder *pbi,
                                         struct aom_read_bit_buffer *rb) {
  AV1_COMMON *const cm = &pbi->common;
  const uint32_t saved_bit_offset = rb->bit_offset;

  // Verify rb has been configured to report errors.
  assert(rb->error_handler);

  // Use a local variable to store the information as we decode. At the end,
  // if no errors have occurred, cm->seq_params is updated.
  SequenceHeader sh = *cm->seq_params;
  SequenceHeader *const seq_params = &sh;

  seq_params->profile = av1_read_profile(rb);
  if (seq_params->profile > CONFIG_MAX_DECODE_PROFILE) {
    pbi->error.error_code = AOM_CODEC_UNSUP_BITSTREAM;
    return 0;
  }

  // Still picture or not
  seq_params->still_picture = aom_rb_read_bit(rb);
  seq_params->reduced_still_picture_hdr = aom_rb_read_bit(rb);
  // Video must have reduced_still_picture_hdr = 0
  if (!seq_params->still_picture && seq_params->reduced_still_picture_hdr) {
    pbi->error.error_code = AOM_CODEC_UNSUP_BITSTREAM;
    return 0;
  }

  if (seq_params->reduced_still_picture_hdr) {
    seq_params->timing_info_present = 0;
    seq_params->decoder_model_info_present_flag = 0;
    seq_params->display_model_info_present_flag = 0;
    seq_params->operating_points_cnt_minus_1 = 0;
    seq_params->operating_point_idc[0] = 0;
    seq_params->has_nonzero_operating_point_idc = false;
    if (!read_bitstream_level(&seq_params->seq_level_idx[0], rb)) {
      pbi->error.error_code = AOM_CODEC_UNSUP_BITSTREAM;
      return 0;
    }
    seq_params->tier[0] = 0;
    seq_params->op_params[0].decoder_model_param_present_flag = 0;
    seq_params->op_params[0].display_model_param_present_flag = 0;
  } else {
    seq_params->timing_info_present = aom_rb_read_bit(rb);
    if (seq_params->timing_info_present) {
      av1_read_timing_info_header(&seq_params->timing_info, &pbi->error, rb);

      seq_params->decoder_model_info_present_flag = aom_rb_read_bit(rb);
      if (seq_params->decoder_model_info_present_flag)
        av1_read_decoder_model_info(&seq_params->decoder_model_info, rb);
    } else {
      seq_params->decoder_model_info_present_flag = 0;
    }
    seq_params->display_model_info_present_flag = aom_rb_read_bit(rb);
    seq_params->operating_points_cnt_minus_1 =
        aom_rb_read_literal(rb, OP_POINTS_CNT_MINUS_1_BITS);
    seq_params->has_nonzero_operating_point_idc = false;
    for (int i = 0; i < seq_params->operating_points_cnt_minus_1 + 1; i++) {
      seq_params->operating_point_idc[i] =
          aom_rb_read_literal(rb, OP_POINTS_IDC_BITS);
      if (seq_params->operating_point_idc[i] != 0)
        seq_params->has_nonzero_operating_point_idc = true;
      if (!read_bitstream_level(&seq_params->seq_level_idx[i], rb)) {
        pbi->error.error_code = AOM_CODEC_UNSUP_BITSTREAM;
        return 0;
      }
      // This is the seq_level_idx[i] > 7 check in the spec. seq_level_idx 7
      // is equivalent to level 3.3.
      if (seq_params->seq_level_idx[i] >= SEQ_LEVEL_4_0)
        seq_params->tier[i] = aom_rb_read_bit(rb);
      else
        seq_params->tier[i] = 0;
      if (seq_params->decoder_model_info_present_flag) {
        seq_params->op_params[i].decoder_model_param_present_flag =
            aom_rb_read_bit(rb);
        if (seq_params->op_params[i].decoder_model_param_present_flag)
          av1_read_op_parameters_info(&seq_params->op_params[i],
                                      seq_params->decoder_model_info
                                          .encoder_decoder_buffer_delay_length,
                                      rb);
      } else {
        seq_params->op_params[i].decoder_model_param_present_flag = 0;
      }
      if (seq_params->timing_info_present &&
          (seq_params->timing_info.equal_picture_interval ||
           seq_params->op_params[i].decoder_model_param_present_flag)) {
        seq_params->op_params[i].bitrate = av1_max_level_bitrate(
            seq_params->profile, seq_params->seq_level_idx[i],
            seq_params->tier[i]);
        // Level with seq_level_idx = 31 returns a high "dummy" bitrate to pass
        // the check
        if (seq_params->op_params[i].bitrate == 0)
          aom_internal_error(&pbi->error, AOM_CODEC_UNSUP_BITSTREAM,
                             "AV1 does not support this combination of "
                             "profile, level, and tier.");
        // Buffer size in bits/s is bitrate in bits/s * 1 s
        seq_params->op_params[i].buffer_size = seq_params->op_params[i].bitrate;
      }
      if (seq_params->timing_info_present &&
          seq_params->timing_info.equal_picture_interval &&
          !seq_params->op_params[i].decoder_model_param_present_flag) {
        // When the decoder_model_parameters are not sent for this op, set
        // the default ones that can be used with the resource availability mode
        seq_params->op_params[i].decoder_buffer_delay = 70000;
        seq_params->op_params[i].encoder_buffer_delay = 20000;
        seq_params->op_params[i].low_delay_mode_flag = 0;
      }

      if (seq_params->display_model_info_present_flag) {
        seq_params->op_params[i].display_model_param_present_flag =
            aom_rb_read_bit(rb);
        if (seq_params->op_params[i].display_model_param_present_flag) {
          seq_params->op_params[i].initial_display_delay =
              aom_rb_read_literal(rb, 4) + 1;
          if (seq_params->op_params[i].initial_display_delay > 10)
            aom_internal_error(
                &pbi->error, AOM_CODEC_UNSUP_BITSTREAM,
                "AV1 does not support more than 10 decoded frames delay");
        } else {
          seq_params->op_params[i].initial_display_delay = 10;
        }
      } else {
        seq_params->op_params[i].display_model_param_present_flag = 0;
        seq_params->op_params[i].initial_display_delay = 10;
      }
    }
  }
  // This decoder supports all levels.  Choose operating point provided by
  // external means
  int operating_point = pbi->operating_point;
  if (operating_point < 0 ||
      operating_point > seq_params->operating_points_cnt_minus_1)
    operating_point = 0;
  pbi->current_operating_point =
      seq_params->operating_point_idc[operating_point];
  if (aom_get_num_layers_from_operating_point_idc(
          pbi->current_operating_point, &pbi->number_spatial_layers,
          &pbi->number_temporal_layers) != AOM_CODEC_OK) {
    pbi->error.error_code = AOM_CODEC_ERROR;
    return 0;
  }

  av1_read_sequence_header(cm, rb, seq_params);

  av1_read_color_config(rb, pbi->allow_lowbitdepth, seq_params, &pbi->error);
  if (!(seq_params->subsampling_x == 0 && seq_params->subsampling_y == 0) &&
      !(seq_params->subsampling_x == 1 && seq_params->subsampling_y == 1) &&
      !(seq_params->subsampling_x == 1 && seq_params->subsampling_y == 0)) {
    aom_internal_error(&pbi->error, AOM_CODEC_UNSUP_BITSTREAM,
                       "Only 4:4:4, 4:2:2 and 4:2:0 are currently supported, "
                       "%d %d subsampling is not supported.\n",
                       seq_params->subsampling_x, seq_params->subsampling_y);
  }

  seq_params->film_grain_params_present = aom_rb_read_bit(rb);

  if (av1_check_trailing_bits(pbi, rb) != 0) {
    // pbi->error.error_code is already set.
    return 0;
  }

  // If a sequence header has been decoded before, we check if the new
  // one is consistent with the old one.
  if (pbi->sequence_header_ready) {
    if (!are_seq_headers_consistent(cm->seq_params, seq_params))
      pbi->sequence_header_changed = 1;
  }

  *cm->seq_params = *seq_params;
  pbi->sequence_header_ready = 1;

  return ((rb->bit_offset - saved_bit_offset + 7) >> 3);
}